

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-test.c++
# Opt level: O0

void __thiscall
capnp::_::anon_unknown_0::TestCallHandler::encode
          (TestCallHandler *this,JsonCodec *codec,Reader input,Builder output)

{
  Builder local_d8;
  Builder local_b0;
  undefined1 local_88 [8];
  Builder params;
  undefined1 local_50 [8];
  Builder call;
  JsonCodec *codec_local;
  TestCallHandler *this_local;
  Reader input_local;
  
  call._builder._32_8_ = codec;
  capnp::json::Value::Builder::initCall((Builder *)local_50,&output);
  Text::Reader::Reader((Reader *)&params.builder.structDataSize,"Frob");
  capnp::json::Value::Call::Builder::setFunction
            ((Builder *)local_50,(Reader)stack0xffffffffffffffa0);
  capnp::json::Value::Call::Builder::initParams((Builder *)local_88,(Builder *)local_50,2);
  List<capnp::json::Value,_(capnp::Kind)3>::Builder::operator[](&local_b0,(Builder *)local_88,0);
  capnp::json::Value::Builder::setNumber(&local_b0,123.0);
  List<capnp::json::Value,_(capnp::Kind)3>::Builder::operator[](&local_d8,(Builder *)local_88,1);
  capnp::json::Value::Builder::setString(&local_d8,input);
  return;
}

Assistant:

void encode(const JsonCodec& codec, Text::Reader input,
              JsonValue::Builder output) const override {
    auto call = output.initCall();
    call.setFunction("Frob");
    auto params = call.initParams(2);
    params[0].setNumber(123);
    params[1].setString(input);
  }